

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::CJoint::Prepare(CJoint *this,btScalar dt,int iterations)

{
  btVector3 *v;
  int iVar1;
  btVector3 bVar2;
  btScalar local_3c;
  btVector3 local_38;
  
  local_3c = dt;
  Joint::Prepare(&this->super_Joint,dt,iterations);
  iVar1 = this->m_life;
  (this->super_Joint).m_delete = this->m_maxlife <= iVar1;
  this->m_life = iVar1 + 1;
  if (iVar1 == 0) {
    v = &(this->super_Joint).m_drift;
    local_38 = operator*(v,&(this->super_Joint).m_erp);
    bVar2 = operator/(&local_38,&local_3c);
    *&(this->super_Joint).m_drift.m_floats = bVar2.m_floats;
    if (0.0 < (this->super_Joint).m_split) {
      local_38 = operator*(v,&(this->super_Joint).m_split);
      bVar2 = operator*(&(this->super_Joint).m_massmatrix,&local_38);
      *&(this->super_Joint).m_sdrift.m_floats = bVar2.m_floats;
      local_38.m_floats[0] = 1.0 - (this->super_Joint).m_split;
      btVector3::operator*=(v,local_38.m_floats);
    }
    local_38.m_floats[0] = (float)iterations;
    btVector3::operator/=(v,local_38.m_floats);
  }
  else {
    (this->super_Joint).m_sdrift.m_floats[0] = 0.0;
    (this->super_Joint).m_sdrift.m_floats[1] = 0.0;
    (this->super_Joint).m_sdrift.m_floats[2] = 0.0;
    (this->super_Joint).m_sdrift.m_floats[3] = 0.0;
    (this->super_Joint).m_drift.m_floats[0] = 0.0;
    (this->super_Joint).m_drift.m_floats[1] = 0.0;
    (this->super_Joint).m_drift.m_floats[2] = 0.0;
    (this->super_Joint).m_drift.m_floats[3] = 0.0;
  }
  return;
}

Assistant:

void				btSoftBody::CJoint::Prepare(btScalar dt,int iterations)
{
	Joint::Prepare(dt,iterations);
	const bool	dodrift=(m_life==0);
	m_delete=(++m_life)>m_maxlife;
	if(dodrift)
	{
		m_drift=m_drift*m_erp/dt;
		if(m_split>0)
		{
			m_sdrift	=	m_massmatrix*(m_drift*m_split);
			m_drift		*=	1-m_split;
		}
		m_drift/=(btScalar)iterations;
	}
	else
	{
		m_drift=m_sdrift=btVector3(0,0,0);
	}
}